

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O1

bool __thiscall asl::TextFile::append(TextFile *this,String *s)

{
  int iVar1;
  size_t sVar2;
  anon_union_16_2_78e7fdac_for_String_2 *__ptr;
  
  if ((this->super_File)._file == (FILE *)0x0) {
    iVar1 = File::open(&this->super_File,(char *)&(this->super_File)._path,10);
    if ((char)iVar1 == '\0') {
      return false;
    }
    if ((this->super_File)._file == (FILE *)0x0) {
      return false;
    }
  }
  if (s->_size == 0) {
    __ptr = &s->field_2;
  }
  else {
    __ptr = (anon_union_16_2_78e7fdac_for_String_2 *)(s->field_2)._str;
  }
  sVar2 = fwrite(__ptr,1,(long)s->_len,(FILE *)(this->super_File)._file);
  return s->_len <= (int)sVar2;
}

Assistant:

bool TextFile::append(const String& s)
{
	if (!_file && !open(APPEND))
		return false;
	return (int)fwrite(*s, 1, s.length(), _file) >= s.length();
}